

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSession::SendRawData(RTPSession *this,void *data,size_t len,bool usertpchannel)

{
  int local_30;
  int status;
  bool usertpchannel_local;
  size_t len_local;
  void *data_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x3e;
  }
  else {
    if (usertpchannel) {
      local_30 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xd])
                           (this->rtptrans,data,len);
    }
    else {
      local_30 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xf])
                           (this->rtptrans,data,len);
    }
    this_local._4_4_ = local_30;
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::SendRawData(const void *data, size_t len, bool usertpchannel)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;

	if (usertpchannel)
		status = rtptrans->SendRTPData(data, len);
	else
		status = rtptrans->SendRTCPData(data, len);
	return status;
}